

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclMarkSkippedCells(SC_Lib *p)

{
  int i;
  FILE *__stream;
  char *pcVar1;
  SC_Cell *pSVar2;
  uint local_808;
  int nSkipped;
  int CellId;
  FILE *pFile;
  SC_Cell *pCell;
  char *pName;
  char Buffer [1000];
  char local_3f8 [8];
  char FileName [1000];
  SC_Lib *p_local;
  
  local_808 = 0;
  FileName._992_8_ = p;
  sprintf(local_3f8,"%s.skip",p->pName);
  __stream = fopen(local_3f8,"rb");
  if (__stream != (FILE *)0x0) {
    while (pcVar1 = fgets((char *)&pName,999,__stream), pcVar1 != (char *)0x0) {
      pcVar1 = strtok((char *)&pName,"\r\n\t ");
      if (pcVar1 != (char *)0x0) {
        i = Abc_SclCellFind((SC_Lib *)FileName._992_8_,pcVar1);
        if (i == -1) {
          printf("Cannot find cell \"%s\" in the library \"%s\".\n",pcVar1,
                 *(undefined8 *)FileName._992_8_);
        }
        else {
          pSVar2 = SC_LibCell((SC_Lib *)FileName._992_8_,i);
          pSVar2->fSkip = 1;
          local_808 = local_808 + 1;
        }
      }
    }
    fclose(__stream);
    printf("Marked %d cells for skipping in the library \"%s\".\n",(ulong)local_808,
           *(undefined8 *)FileName._992_8_);
  }
  return;
}

Assistant:

void Abc_SclMarkSkippedCells( SC_Lib * p )
{
    char FileName[1000];
    char Buffer[1000], * pName;
    SC_Cell * pCell;
    FILE * pFile;
    int CellId, nSkipped = 0;
    sprintf( FileName, "%s.skip", p->pName );
    pFile = fopen( FileName, "rb" );
    if ( pFile == NULL )
        return;
    while ( fgets( Buffer, 999, pFile ) != NULL )
    {
        pName = strtok( Buffer, "\r\n\t " );
        if ( pName == NULL )
            continue;
        CellId = Abc_SclCellFind( p, pName );
        if ( CellId == -1 )
        {
            printf( "Cannot find cell \"%s\" in the library \"%s\".\n", pName, p->pName );
            continue;
        }
        pCell = SC_LibCell( p, CellId );
        pCell->fSkip = 1;
        nSkipped++;
    }
    fclose( pFile );
    printf( "Marked %d cells for skipping in the library \"%s\".\n", nSkipped, p->pName );
}